

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O2

void objAppend(void *dest,void *src,size_t i)

{
  long lVar1;
  
  lVar1 = *src;
  objCopy((void *)(*dest + (long)dest),src);
  *(long *)((long)dest + i * 8 + 0x18) = *dest + (long)dest;
  *(long *)dest = *dest + lVar1;
  return;
}

Assistant:

void objAppend(void* dest, const void* src, size_t i)
{
	size_t t;
	// pre
	ASSERT(objIsOperable(src));
	ASSERT(objIsOperable(dest));
	ASSERT(memIsValid(objEnd(dest, void), objKeep(src)));
	ASSERT(i < objOCount(dest));
	// запомнить размер src
	t = objKeep(src);
	// скопировать src в конец dest
	objCopy(objEnd(dest, void), src);
	// установить ссылку на конец dest
	objPtr(dest, i, void) = objEnd(dest, void);
	// расширить dest
	objHdr(dest)->keep += t;
}